

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_list.c
# Opt level: O2

apx_error_t
apx_portConnectorList_insert(apx_portConnectorList_t *self,apx_portInstance_t *port_instance)

{
  adt_error_t aVar1;
  apx_error_t aVar2;
  
  if (port_instance != (apx_portInstance_t *)0x0 && self != (apx_portConnectorList_t *)0x0) {
    aVar1 = adt_ary_push(&self->require_ports,port_instance);
    aVar2 = 0;
    if (aVar1 != '\0') {
      aVar2 = (uint)(aVar1 == '\x02') * 3 + -1;
    }
    return aVar2;
  }
  return 1;
}

Assistant:

apx_error_t apx_portConnectorList_insert(apx_portConnectorList_t* self, apx_portInstance_t* port_instance)
{
   if ( (self != NULL) && (port_instance != NULL) )
   {
      apx_error_t retval = APX_NO_ERROR;
      adt_error_t result = adt_ary_push(&self->require_ports, (void*)port_instance);
      if (result != ADT_NO_ERROR)
      {
         if (result == ADT_MEM_ERROR)
         {
            retval = APX_MEM_ERROR;
         }
         else
         {
            retval = APX_GENERIC_ERROR; //unhandled error
         }
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}